

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
SmallArray<LlvmCompilationContext::LoopInfo,_32U>::grow
          (SmallArray<LlvmCompilationContext::LoopInfo,_32U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  LoopInfo *pLVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  LoopInfo *__s;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = (this->max >> 1) + this->max;
  uVar4 = newSize + 4;
  if (newSize < uVar8) {
    uVar4 = uVar8;
  }
  if (this->allocator == (Allocator *)0x0) {
    __s = (LoopInfo *)(*(code *)NULLC::alloc)(uVar4 << 4 | 4);
  }
  else {
    iVar6 = (*this->allocator->_vptr_Allocator[2])();
    __s = (LoopInfo *)CONCAT44(extraout_var,iVar6);
  }
  if (uVar4 != 0) {
    memset(__s,0,(long)(int)uVar4 << 4);
  }
  if (this->count != 0) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      puVar1 = (undefined8 *)((long)&this->data->breakBlock + lVar7);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&__s->breakBlock + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar9 < this->count);
  }
  pLVar3 = this->data;
  if (pLVar3 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pLVar3 != (LoopInfo *)0x0) {
        (*(code *)NULLC::dealloc)(pLVar3);
      }
    }
    else if (pLVar3 != (LoopInfo *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = __s;
  this->max = uVar4;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}